

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_shader.h
# Opt level: O0

GLuint s_loadShader(GLenum type,char *source)

{
  GLchar *__ptr;
  char *infoLog;
  int local_20;
  GLint infoLen;
  GLint compiled;
  GLuint shader;
  char *source_local;
  GLenum type_local;
  
  _compiled = source;
  source_local._0_4_ = type;
  infoLen = (*glad_glCreateShader)(type);
  if (infoLen == 0) {
    fprintf(_stderr,"Could not create shader!\n");
    source_local._4_4_ = 0;
  }
  else {
    (*glad_glShaderSource)(infoLen,1,(GLchar **)&compiled,(GLint *)0x0);
    (*glad_glCompileShader)(infoLen);
    (*glad_glGetShaderiv)(infoLen,0x8b81,&local_20);
    if (local_20 == 0) {
      fprintf(_stderr,"Could not compile shader!\n");
      infoLog._4_4_ = 0;
      (*glad_glGetShaderiv)(infoLen,0x8b84,(GLint *)((long)&infoLog + 4));
      if (infoLog._4_4_ != 0) {
        __ptr = (GLchar *)malloc((long)infoLog._4_4_);
        (*glad_glGetShaderInfoLog)(infoLen,infoLog._4_4_,(GLsizei *)0x0,__ptr);
        fprintf(_stderr,"%s\n",__ptr);
        free(__ptr);
      }
      (*glad_glDeleteShader)(infoLen);
      source_local._4_4_ = 0;
    }
    else {
      source_local._4_4_ = infoLen;
    }
  }
  return source_local._4_4_;
}

Assistant:

static GLuint s_loadShader(GLenum type, const char *source)
{
	GLuint shader = glCreateShader(type);
	if (shader == 0)
	{
		fprintf(stderr, "Could not create shader!\n");
		return 0;
	}
	glShaderSource(shader, 1, &source, NULL);
	glCompileShader(shader);
	GLint compiled;
	glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
	if (!compiled)
	{
		fprintf(stderr, "Could not compile shader!\n");
		GLint infoLen = 0;
		glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLen);
		if (infoLen)
		{
			char* infoLog = (char*)malloc(infoLen);
			glGetShaderInfoLog(shader, infoLen, NULL, infoLog);
			fprintf(stderr, "%s\n", infoLog);
			free(infoLog);
		}
		glDeleteShader(shader);
		return 0;
	}
	return shader;
}